

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void readfiles(char *path,char *s,uchar (*pic) [512] [512],float sigma,int pic_t,int *pic_x,
              int *pic_y,int start,int end,uchar *header)

{
  bool bVar1;
  FILE *__stream;
  size_t sVar2;
  FILE *fp;
  int ints [8];
  uint local_118;
  int ONCE;
  int no_bytes;
  int time;
  int j;
  int i;
  char fname [200];
  int *pic_y_local;
  int *pic_x_local;
  int pic_t_local;
  float sigma_local;
  uchar (*pic_local) [512] [512];
  char *s_local;
  char *path_local;
  
  printf("Reading Files...\n");
  ONCE = -1;
  if (end - start < 0) {
    printf("\nSpecified time for writing file incorrect\n");
    exit(1);
  }
  bVar1 = true;
  time = start;
  while( true ) {
    if (end < time) {
      return;
    }
    ONCE = ONCE + 1;
    local_118 = 0;
    sprintf((char *)&j,"%s/%s%d",path,s,(ulong)(uint)time);
    __stream = fopen((char *)&j,"rb");
    if (__stream == (FILE *)0x0) break;
    if (BINARY == 0) {
      if (bVar1) {
        sVar2 = fread(&fp,4,8,__stream);
        local_118 = (uint)(sVar2 << 2);
        *pic_y = fp._4_4_;
        *pic_x = ints[0];
        bVar1 = false;
      }
      else {
        sVar2 = fread(header,1,0x20,__stream);
        local_118 = (uint)sVar2;
      }
    }
    for (no_bytes = 0; no_bytes < *pic_x; no_bytes = no_bytes + 1) {
      sVar2 = fread(pic[ONCE] + no_bytes,1,(long)*pic_y,__stream);
      local_118 = local_118 + (int)sVar2;
    }
    printf("File %s read (%d bytes)\n",&j,(ulong)local_118);
    fclose(__stream);
    fflush(_stdout);
    time = time + 1;
  }
  printf("File %s does not exist in readfiles.\n",&j);
  exit(1);
}

Assistant:

void readfiles(char path[], char s[],
unsigned char pic[][PIC_X][PIC_Y],
float sigma, int pic_t, int *pic_x, int *pic_y, int start, int end,
unsigned char header[HEAD])

{
char fname[200];
int i,j,time,no_bytes;
int ONCE;
int ints[8];
FILE *fp;


printf("Reading Files...\n");
time = -1;
if((end-start) < 0)
	{
	printf("\nSpecified time for writing file incorrect\n");
	exit(1);
	}
ONCE = TRUE;
for(i=start;i<=end;i++)
	{
	time++;
	no_bytes = 0;
	sprintf(fname,"%s/%s%d",path,s,i);  //.ras
 	if((fp=fopen(fname,"rb")) != NULL)
		{
		if(!BINARY)
		{
		if(ONCE)
		{
		no_bytes += (4*fread(ints, sizeof(int), 8, fp));
		(*pic_y) = ints[1];
		(*pic_x) = ints[2];
		ONCE = FALSE;
		}
		else no_bytes += fread(header, sizeof(unsigned char), HEAD, fp);
		}

		for(j=0;j<(*pic_x);j++)
			no_bytes += fread(&pic[time][j][0],sizeof(unsigned char), (*pic_y), fp);
		printf("File %s read (%d bytes)\n",fname,no_bytes);
		no_bytes = 0;
		fclose(fp);
		}
	else
		{
		printf("File %s does not exist in readfiles.\n",fname);
		exit(1);
		}
	fflush(stdout);
	}
}